

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment_tree.hpp
# Opt level: O1

void __thiscall
duckdb::SegmentTree<duckdb::RowGroup,_true>::AppendSegment
          (SegmentTree<duckdb::RowGroup,_true> *this,
          unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *segment)

{
  _Head_base<0UL,_duckdb::RowGroup_*,_false> _Var1;
  SegmentLock l;
  _Head_base<0UL,_duckdb::RowGroup_*,_false> local_30;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &this->node_lock;
  local_28._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  local_30._M_head_impl =
       (segment->super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)._M_t.
       super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
       super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl;
  (segment->super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)._M_t.
  super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
  super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl = (RowGroup *)0x0;
  AppendSegment(this,(SegmentLock *)&local_28,
                (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)
                &local_30);
  _Var1._M_head_impl = local_30._M_head_impl;
  if (local_30._M_head_impl != (RowGroup *)0x0) {
    RowGroup::~RowGroup(local_30._M_head_impl);
    operator_delete(_Var1._M_head_impl);
  }
  local_30._M_head_impl = (RowGroup *)0x0;
  ::std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void AppendSegment(unique_ptr<T> segment) {
		auto l = Lock();
		AppendSegment(l, std::move(segment));
	}